

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall crsGA::Logger::stopProcessingMessages(Logger *this)

{
  bool bVar1;
  undefined1 local_50 [8];
  LogMessage logMessage;
  Logger *this_local;
  
  logMessage.msg.field_2._8_8_ = this;
  std::atomic<bool>::operator=(&this->_exit,true);
  ThreadSafeQueue<crsGA::Logger::LogMessage>::notify_and_terminate(&this->_queue);
  bVar1 = std::thread::joinable(&this->_thread);
  if (bVar1) {
    std::thread::join();
  }
  while (bVar1 = ThreadSafeQueue<crsGA::Logger::LogMessage>::empty(&this->_queue),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    LogMessage::LogMessage((LogMessage *)local_50);
    bVar1 = ThreadSafeQueue<crsGA::Logger::LogMessage>::pop(&this->_queue,(LogMessage *)local_50);
    if (bVar1) {
      dispatchLogMessage(this,(LogMessage *)local_50);
    }
    LogMessage::~LogMessage((LogMessage *)local_50);
  }
  return;
}

Assistant:

void Logger::stopProcessingMessages()
{
    _exit = true;
    _queue.notify_and_terminate();
    if (_thread.joinable())
        _thread.join();
    // purge messages
    while (!_queue.empty())
    {
        LogMessage logMessage;
        if (_queue.pop(logMessage))
        {
            dispatchLogMessage(logMessage);
        }
    }
}